

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong_conflict helper_modsub_mipsel(target_ulong_conflict rs,target_ulong_conflict rt)

{
  undefined4 local_1c;
  target_ulong_conflict rd;
  uint16_t lastindex;
  int32_t decr;
  target_ulong_conflict rt_local;
  target_ulong_conflict rs_local;
  
  if (rs == 0) {
    local_1c = rt >> 8 & 0xffff;
  }
  else {
    local_1c = rs - (rt & 0xff);
  }
  return local_1c;
}

Assistant:

target_ulong helper_modsub(target_ulong rs, target_ulong rt)
{
    int32_t decr;
    uint16_t lastindex;
    target_ulong rd;

    decr = rt & MIPSDSP_Q0;
    lastindex = (rt >> 8) & MIPSDSP_LO;

    if ((rs & MIPSDSP_LLO) == 0x00000000) {
        rd = (target_ulong)lastindex;
    } else {
        rd = rs - decr;
    }

    return rd;
}